

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_attribute_iterator * __thiscall
pugi::xml_attribute_iterator::operator--(xml_attribute_iterator *this)

{
  xml_attribute xVar1;
  
  if ((this->_wrap)._attr == (xml_attribute_struct *)0x0) {
    xVar1 = xml_node::last_attribute(&this->_parent);
  }
  else {
    xVar1 = xml_attribute::previous_attribute(&this->_wrap);
  }
  (this->_wrap)._attr = xVar1._attr;
  return this;
}

Assistant:

PUGI__FN const xml_attribute_iterator& xml_attribute_iterator::operator--()
	{
		_wrap = _wrap._attr ? _wrap.previous_attribute() : _parent.last_attribute();
		return *this;
	}